

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::FuncFrame::finalize(FuncFrame *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 uVar5;
  RegMask RVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  Error EVar10;
  byte *pbVar11;
  uint *puVar12;
  InstHints *pIVar13;
  uint uVar14;
  byte bVar15;
  int iVar16;
  byte bVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint32_t uVar21;
  byte bVar22;
  Iterator __begin2;
  RegGroup group;
  long lVar23;
  RegGroup local_76 [6];
  FuncAttributes local_70;
  uint local_6c;
  byte *local_68;
  Array<asmjit::v1_14::InstHints,_4UL> *local_60;
  uint32_t saveRestoreSizes [2];
  
  if ((byte)(this->_arch - k32BitMask) < 0x10) {
    lVar23 = (ulong)this->_arch * 0xd8;
    local_76[5] = 0;
    pbVar11 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                        (&this->_saveRestoreRegSize,local_76 + 5);
    bVar15 = *pbVar11;
    local_76[4] = 1;
    pbVar11 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                        (&this->_saveRestoreRegSize,local_76 + 4);
    bVar1 = _archTraits[lVar23 + 2];
    local_6c = (uint)bVar15;
    uVar18 = 0;
    if (bVar1 == 0xff) {
      uVar18 = local_6c;
    }
    bVar15 = this->_callStackAlignment;
    if (this->_callStackAlignment < this->_naturalStackAlignment) {
      bVar15 = this->_naturalStackAlignment;
    }
    bVar2 = this->_finalStackAlignment;
    uVar5 = this->_localStackAlignment;
    if (bVar15 <= (byte)uVar5) {
      bVar15 = uVar5;
    }
    if (bVar2 != bVar15) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/func.cpp"
                 ,0x99,
                 "stackAlignment == Support::max(_naturalStackAlignment, _callStackAlignment, _localStackAlignment)"
                );
    }
    local_68 = _archTraits + lVar23;
    bVar15 = *pbVar11;
    local_70 = this->_attributes;
    bVar3 = this->_minDynamicAlignment;
    bVar4 = *local_68;
    bVar17 = _archTraits[lVar23 + 1];
    bVar22 = bVar4;
    if ((local_70 & kHasPreservedFP) != kNoAttributes) {
      local_60 = (Array<asmjit::v1_14::InstHints,_4UL> *)CONCAT71(local_60._1_7_,bVar4);
      local_76[3] = 0;
      puVar12 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                          (&this->_dirtyRegs,local_76 + 3);
      *puVar12 = *puVar12 | 1 << (bVar17 & 0x1f);
      bVar22 = (byte)local_60;
      if (bVar1 != 0xff) {
        local_76[2] = 0;
        puVar12 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                            (&this->_dirtyRegs,local_76 + 2);
        *puVar12 = *puVar12 | 1 << (bVar1 & 0x1f);
        bVar22 = (byte)local_60;
      }
    }
    bVar1 = this->_saRegId;
    if (this->_saRegId == 0xff) {
      bVar1 = bVar4;
    }
    if (bVar1 != bVar4) {
      bVar17 = bVar1;
    }
    if (bVar2 < bVar3) {
      bVar17 = bVar1;
    }
    if (bVar17 != bVar4) {
      local_76[1] = 0;
      puVar12 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                          (&this->_dirtyRegs,local_76 + 1);
      *puVar12 = *puVar12 | 1 << (bVar17 & 0x1f);
    }
    this->_spRegId = bVar22;
    this->_saRegId = bVar17;
    saveRestoreSizes[0] = 0;
    saveRestoreSizes[1] = 0;
    local_60 = (Array<asmjit::v1_14::InstHints,_4UL> *)(local_68 + 0x10);
    for (group = k0; group != kPC; group = group + kVec) {
      RVar6 = savedRegs(this,group);
      uVar7 = RVar6 - (RVar6 >> 1 & 0x55555555);
      uVar7 = (uVar7 >> 2 & 0x33333333) + (uVar7 & 0x33333333);
      uVar8 = saveRestoreRegSize(this,group);
      uVar9 = saveRestoreAlignment(this,group);
      local_76[0] = group;
      pIVar13 = Support::Array<asmjit::v1_14::InstHints,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                          (local_60,local_76);
      saveRestoreSizes[(*pIVar13 & kPushPop) == kNoHints] =
           saveRestoreSizes[(*pIVar13 & kPushPop) == kNoHints] +
           (-uVar9 & (uVar8 * (((uVar7 >> 4) + uVar7 & 0xf0f0f0f) * 0x1010101 >> 0x18) + uVar9) - 1)
      ;
    }
    this->_pushPopSaveSize = (uint16_t)saveRestoreSizes[0];
    this->_extraRegSaveSize = (uint16_t)saveRestoreSizes[1];
    iVar16 = bVar2 - 1;
    uVar7 = -(uint)bVar2;
    uVar19 = this->_callStackSize + iVar16 & uVar7;
    this->_localStackOffset = uVar19;
    uVar8 = uVar19 + this->_localStackSize;
    if ((bVar15 <= bVar2) && ((uint16_t)saveRestoreSizes[1] != 0)) {
      *(undefined1 *)&this->_attributes = (char)this->_attributes | kAlignedVecSR;
      uVar8 = -(uint)bVar15 & (uVar8 + bVar15) - 1;
    }
    uVar14 = saveRestoreSizes[0] & 0xffff;
    this->_extraRegSaveOffset = uVar8;
    uVar8 = (saveRestoreSizes[1] & 0xffff) + uVar8;
    uVar21 = 0xffffffff;
    uVar19 = 0;
    uVar9 = uVar21;
    if ((local_70 & kHasPreservedFP) == kNoAttributes && bVar3 <= bVar2) {
      uVar19 = local_6c;
      uVar9 = uVar8;
    }
    this->_daOffset = uVar9;
    iVar20 = uVar19 + uVar8;
    if (((iVar20 == 0) && ((this->_attributes & kHasFuncCalls) == kNoAttributes)) && (uVar18 != 0))
    {
      uVar8 = 0;
    }
    else {
      uVar8 = (iVar20 + uVar14 + uVar18 + iVar16 & uVar7) - (uVar14 + uVar18);
    }
    this->_pushPopSaveOffset = uVar8;
    this->_stackAdjustment = uVar8;
    this->_finalStackSize = uVar8 + uVar14;
    EVar10 = 0;
    uVar19 = 0;
    if (local_68[2] == 0xff) {
      uVar19 = local_6c;
    }
    if (bVar2 < bVar3) {
      uVar21 = uVar19 + uVar8 + uVar14;
    }
    else {
      this->_stackAdjustment = uVar8 + iVar16 & uVar7;
    }
    this->_saOffsetFromSP = uVar21;
    if ((local_70 & kHasPreservedFP) == kNoAttributes) {
      local_6c = uVar14;
    }
    this->_saOffsetFromSA = local_6c + uVar18;
  }
  else {
    EVar10 = 4;
  }
  return EVar10;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncFrame::finalize() noexcept {
  if (!Environment::isValidArch(arch()))
    return DebugUtils::errored(kErrorInvalidArch);

  const ArchTraits& archTraits = ArchTraits::byArch(arch());

  uint32_t registerSize = _saveRestoreRegSize[RegGroup::kGp];
  uint32_t vectorSize = _saveRestoreRegSize[RegGroup::kVec];
  uint32_t returnAddressSize = archTraits.hasLinkReg() ? 0u : registerSize;

  // The final stack alignment must be updated accordingly to call and local stack alignments.
  uint32_t stackAlignment = _finalStackAlignment;
  ASMJIT_ASSERT(stackAlignment == Support::max(_naturalStackAlignment,
                                               _callStackAlignment,
                                               _localStackAlignment));

  bool hasFP = hasPreservedFP();
  bool hasDA = hasDynamicAlignment();

  uint32_t kSp = archTraits.spRegId();
  uint32_t kFp = archTraits.fpRegId();
  uint32_t kLr = archTraits.linkRegId();

  // Make frame pointer dirty if the function uses it.
  if (hasFP) {
    _dirtyRegs[RegGroup::kGp] |= Support::bitMask(kFp);

    // Currently required by ARM, if this works differently across architectures we would have to generalize most
    // likely in CallConv.
    if (kLr != BaseReg::kIdBad)
      _dirtyRegs[RegGroup::kGp] |= Support::bitMask(kLr);
  }

  // These two are identical if the function doesn't align its stack dynamically.
  uint32_t saRegId = _saRegId;
  if (saRegId == BaseReg::kIdBad)
    saRegId = kSp;

  // Fix stack arguments base-register from SP to FP in case it was not picked before and the function performs
  // dynamic stack alignment.
  if (hasDA && saRegId == kSp)
    saRegId = kFp;

  // Mark as dirty any register but SP if used as SA pointer.
  if (saRegId != kSp)
    _dirtyRegs[RegGroup::kGp] |= Support::bitMask(saRegId);

  _spRegId = uint8_t(kSp);
  _saRegId = uint8_t(saRegId);

  // Setup stack size used to save preserved registers.
  uint32_t saveRestoreSizes[2] {};
  for (RegGroup group : RegGroupVirtValues{})
    saveRestoreSizes[size_t(!archTraits.hasInstPushPop(group))]
      += Support::alignUp(Support::popcnt(savedRegs(group)) * saveRestoreRegSize(group), saveRestoreAlignment(group));

  _pushPopSaveSize  = uint16_t(saveRestoreSizes[0]);
  _extraRegSaveSize = uint16_t(saveRestoreSizes[1]);

  uint32_t v = 0;                            // The beginning of the stack frame relative to SP after prolog.
  v += callStackSize();                      // Count 'callStackSize'      <- This is used to call functions.
  v  = Support::alignUp(v, stackAlignment);  // Align to function's stack alignment.

  _localStackOffset = v;                     // Store 'localStackOffset'   <- Function's local stack starts here.
  v += localStackSize();                     // Count 'localStackSize'     <- Function's local stack ends here.

  // If the function's stack must be aligned, calculate the alignment necessary to store vector registers, and set
  // `FuncAttributes::kAlignedVecSR` to inform PEI that it can use instructions that perform aligned stores/loads.
  if (stackAlignment >= vectorSize && _extraRegSaveSize) {
    addAttributes(FuncAttributes::kAlignedVecSR);
    v = Support::alignUp(v, vectorSize);     // Align 'extraRegSaveOffset'.
  }

  _extraRegSaveOffset = v;                   // Store 'extraRegSaveOffset' <- Non-GP save/restore starts here.
  v += _extraRegSaveSize;                    // Count 'extraRegSaveSize'   <- Non-GP save/restore ends here.

  // Calculate if dynamic alignment (DA) slot (stored as offset relative to SP) is required and its offset.
  if (hasDA && !hasFP) {
    _daOffset = v;                           // Store 'daOffset'           <- DA pointer would be stored here.
    v += registerSize;                       // Count 'daOffset'.
  }
  else {
    _daOffset = FuncFrame::kTagInvalidOffset;
  }

  // Link Register
  // -------------
  //
  // The stack is aligned after the function call as the return address is stored in a link register. Some
  // architectures may require to always have aligned stack after PUSH/POP operation, which is represented
  // by ArchTraits::stackAlignmentConstraint().
  //
  // No Link Register (X86/X64)
  // --------------------------
  //
  // The return address should be stored after GP save/restore regs. It has the same size as `registerSize`
  // (basically the native register/pointer size). We don't adjust it now as `v` now contains the exact size
  // that the function requires to adjust (call frame + stack frame, vec stack size). The stack (if we consider
  // this size) is misaligned now, as it's always aligned before the function call - when `call()` is executed
  // it pushes the current EIP|RIP onto the stack, and misaligns it by 12 or 8 bytes (depending on the
  // architecture). So count number of bytes needed to align it up to the function's CallFrame (the beginning).
  if (v || hasFuncCalls() || !returnAddressSize)
    v += Support::alignUpDiff(v + pushPopSaveSize() + returnAddressSize, stackAlignment);

  _pushPopSaveOffset = v;                    // Store 'pushPopSaveOffset'  <- Function's push/pop save/restore starts here.
  _stackAdjustment = v;                      // Store 'stackAdjustment'    <- SA used by 'add SP, SA' and 'sub SP, SA'.
  v += _pushPopSaveSize;                     // Count 'pushPopSaveSize'    <- Function's push/pop save/restore ends here.
  _finalStackSize = v;                       // Store 'finalStackSize'     <- Final stack used by the function.

  if (!archTraits.hasLinkReg())
    v += registerSize;                       // Count 'ReturnAddress'      <- As CALL pushes onto stack.

  // If the function performs dynamic stack alignment then the stack-adjustment must be aligned.
  if (hasDA)
    _stackAdjustment = Support::alignUp(_stackAdjustment, stackAlignment);

  // Calculate where the function arguments start relative to SP.
  _saOffsetFromSP = hasDA ? FuncFrame::kTagInvalidOffset : v;

  // Calculate where the function arguments start relative to FP or user-provided register.
  _saOffsetFromSA = hasFP ? returnAddressSize + registerSize      // Return address + frame pointer.
                          : returnAddressSize + _pushPopSaveSize; // Return address + all push/pop regs.

  return kErrorOk;
}